

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlXPathObjectPtr xmlXPtrWrapLocationSet(xmlLocationSetPtr val)

{
  xmlXPathObjectPtr ret;
  xmlLocationSetPtr val_local;
  
  val_local = (xmlLocationSetPtr)(*xmlMalloc)(0x48);
  if (val_local == (xmlLocationSetPtr)0x0) {
    xmlXPtrErrMemory("allocating locationset");
    val_local = (xmlLocationSetPtr)0x0;
  }
  else {
    memset(val_local,0,0x48);
    val_local->locNr = 7;
    val_local[2].locTab = (xmlXPathObjectPtr *)val;
  }
  return (xmlXPathObjectPtr)val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrWrapLocationSet(xmlLocationSetPtr val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPtrErrMemory("allocating locationset");
	return(NULL);
    }
    memset(ret, 0 , (size_t) sizeof(xmlXPathObject));
    ret->type = XPATH_LOCATIONSET;
    ret->user = (void *) val;
    return(ret);
}